

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_randomize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  int local_74;
  int count;
  size_t p_size;
  mbedtls_mpi ll;
  mbedtls_mpi l;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  sVar1 = grp->pbits;
  local_74 = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&ll.p);
  mbedtls_mpi_init((mbedtls_mpi *)&p_size);
  do {
    mbedtls_mpi_fill_random((mbedtls_mpi *)&ll.p,sVar1 + 7 >> 3,f_rng,p_rng);
    while (iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&ll.p,&grp->P), -1 < iVar2) {
      l.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&ll.p,1);
      if (l.p._4_4_ != 0) goto LAB_00128728;
    }
    if (10 < local_74) {
      return -0x4d00;
    }
    iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&ll.p,1);
    local_74 = local_74 + 1;
  } while (iVar2 < 1);
  l.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->Z,&pt->Z,(mbedtls_mpi *)&ll.p);
  if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp(&pt->Z,grp), l.p._4_4_ == 0)) {
    mul_count = mul_count + 1;
    l.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&p_size,(mbedtls_mpi *)&ll.p,(mbedtls_mpi *)&ll.p
                                   );
    if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp((mbedtls_mpi *)&p_size,grp), l.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      l.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->X,&pt->X,(mbedtls_mpi *)&p_size);
      if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp(&pt->X,grp), l.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        l.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&p_size,(mbedtls_mpi *)&p_size,
                                        (mbedtls_mpi *)&ll.p);
        if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp((mbedtls_mpi *)&p_size,grp), l.p._4_4_ == 0))
        {
          mul_count = mul_count + 1;
          l.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->Y,&pt->Y,(mbedtls_mpi *)&p_size);
          if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp(&pt->Y,grp), l.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
          }
        }
      }
    }
  }
LAB_00128728:
  mbedtls_mpi_free((mbedtls_mpi *)&ll.p);
  mbedtls_mpi_free((mbedtls_mpi *)&p_size);
  return l.p._4_4_;
}

Assistant:

static int ecp_randomize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;
    mbedtls_mpi l, ll;
    size_t p_size = ( grp->pbits + 7 ) / 8;
    int count = 0;

    mbedtls_mpi_init( &l ); mbedtls_mpi_init( &ll );

    /* Generate l such that 1 < l < p */
    do
    {
        mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    /* Z = l * Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Z,   &pt->Z,     &l  ) ); MOD_MUL( pt->Z );

    /* X = l^2 * X */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ll,      &l,         &l  ) ); MOD_MUL( ll );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->X,   &pt->X,     &ll ) ); MOD_MUL( pt->X );

    /* Y = l^3 * Y */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ll,      &ll,        &l  ) ); MOD_MUL( ll );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Y,   &pt->Y,     &ll ) ); MOD_MUL( pt->Y );

cleanup:
    mbedtls_mpi_free( &l ); mbedtls_mpi_free( &ll );

    return( ret );
}